

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_generate.cc
# Opt level: O2

void __thiscall
IncrementalEditDistance::IncrementalEditDistance
          (IncrementalEditDistance *this,string *target,size_t subst_cost,size_t ins_cost,
          size_t del_cost)

{
  size_t *psVar1;
  size_t sVar2;
  ulong uVar3;
  size_t sVar4;
  allocator local_39;
  vector<char,_std::allocator<char>_> *local_38;
  
  std::__cxx11::string::string((string *)&this->target,(string *)target);
  this->subst_cost = subst_cost;
  this->ins_cost = ins_cost;
  this->del_cost = del_cost;
  this->N = target->_M_string_length;
  std::__cxx11::string::string((string *)&this->output_string,"",&local_39);
  local_38 = &this->A;
  (this->A).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (this->A).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->A).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  sVar4 = this->N;
  uVar3 = -(ulong)(sVar4 + 1 >> 0x3d != 0) | sVar4 * 8 + 8;
  psVar1 = (size_t *)operator_new__(uVar3);
  this->prev_row = psVar1;
  psVar1 = (size_t *)operator_new__(uVar3);
  this->cur_row = psVar1;
  sVar2 = 0;
  for (uVar3 = 0; uVar3 <= sVar4; uVar3 = uVar3 + 1) {
    this->prev_row[uVar3] = sVar2;
    sVar4 = this->N;
    sVar2 = sVar2 + del_cost;
  }
  this->prev_row_min = 0;
  return;
}

Assistant:

IncrementalEditDistance(string& target, size_t subst_cost=1, size_t ins_cost=1, size_t del_cost=1)
    : target(target), subst_cost(subst_cost), ins_cost(ins_cost), del_cost(del_cost), N(target.length()), output_string("")
  { prev_row = new size_t[N+1];
    cur_row  = new size_t[N+1];

    for (size_t n=0; n<=N; n++)
      prev_row[n] = del_cost * n;

    prev_row_min = 0;
  }